

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O0

CreateCharacterState * __thiscall
CreateCharacterState::ShowStats_abi_cxx11_(CreateCharacterState *this)

{
  ostream *poVar1;
  long in_RSI;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  CreateCharacterState *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"1 Strength      : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x48));
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"2 Endurance     : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x4c));
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"3 Intelligence  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x50));
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"4 Dexterity     : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x54));
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"5 Skill         : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x58));
  std::operator<<(poVar1,"\r\n");
  poVar1 = std::operator<<(local_190,"Points remaining: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x44));
  std::operator<<(poVar1,"\r\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string CreateCharacterState::ShowStats() {
    std::stringstream ss;
    ss << "1 Strength      : " << m_str << "\r\n";
    ss << "2 Endurance     : " << m_end << "\r\n";
    ss << "3 Intelligence  : " << m_int << "\r\n";
    ss << "4 Dexterity     : " << m_dex << "\r\n";
    ss << "5 Skill         : " << m_skill << "\r\n";
    ss << "Points remaining: " << m_att_points << "\r\n";
    return ss.str();
}